

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_monte_carlo.cpp
# Opt level: O1

double * line01_sample_ergodic(int n,double *shift)

{
  double *pdVar1;
  ulong uVar2;
  double dVar3;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = (long)n * 8;
  }
  pdVar1 = (double *)operator_new__(uVar2);
  dVar3 = fmod(*shift,1.0);
  *shift = dVar3;
  if (0 < n) {
    uVar2 = 0;
    do {
      dVar3 = *shift;
      pdVar1[uVar2] = dVar3;
      dVar3 = fmod(dVar3 + 1.618033988749895,1.0);
      *shift = dVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return pdVar1;
}

Assistant:

double *line01_sample_ergodic ( int n, double &shift )

//****************************************************************************80
//
//  Purpose:
//
//    LINE01_SAMPLE_ERGODIC samples the unit line in 1D.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    07 June 2017
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of points.
//
//    Input/output, double &SHIFT, a value between 0 and 1.
//
//    Output, double X[N], the points.
//
{
  double golden;
  int j;
  double *x;

  golden = ( 1.0 + sqrt ( 5.0 ) ) / 2.0;

  x = new double[n];

  shift = fmod ( shift, 1.0 );

  for ( j = 0; j < n; j++ )
  {
    x[j] = shift;
    shift = fmod ( shift + golden, 1.0 );
  }

  return x;
}